

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t fmovem_postinc(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask,
                       float_access access_fn)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  int local_2c;
  int size;
  int i;
  uintptr_t ra;
  float_access access_fn_local;
  uint32_t mask_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  access_fn_local._0_4_ = mask;
  access_fn_local._4_4_ = addr;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    if (((uint32_t)access_fn_local & 0x80) != 0) {
      iVar1 = (*access_fn)(env,access_fn_local._4_4_,env->fregs + local_2c,unaff_retaddr);
      access_fn_local._4_4_ = iVar1 + access_fn_local._4_4_;
    }
    access_fn_local._0_4_ = (uint32_t)access_fn_local << 1;
  }
  return access_fn_local._4_4_;
}

Assistant:

static uint32_t fmovem_postinc(CPUM68KState *env, uint32_t addr, uint32_t mask,
                               float_access access_fn)
{
    uintptr_t ra = GETPC();
    int i, size;

    for (i = 0; i < 8; i++, mask <<= 1) {
        if (mask & 0x80) {
            size = access_fn(env, addr, &env->fregs[i], ra);
            addr += size;
        }
    }

    return addr;
}